

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

TableDeleteState * __thiscall
duckdb::InsertLocalState::GetDeleteState
          (InsertLocalState *this,DataTable *table,TableCatalogEntry *table_ref,
          ClientContext *context)

{
  __uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_> __p;
  tuple<duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_> in_RAX;
  type pTVar1;
  _Head_base<0UL,_duckdb::TableDeleteState_*,_false> local_18;
  
  local_18._M_head_impl =
       (TableDeleteState *)
       in_RAX.
       super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
       .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl;
  if ((this->delete_state).
      super_unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
      .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl ==
      (TableDeleteState *)0x0) {
    DataTable::InitializeDelete
              ((DataTable *)&stack0xffffffffffffffe8,(TableCatalogEntry *)table,
               (ClientContext *)table_ref,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)context);
    __p._M_t.
    super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
    .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl =
         (tuple<duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>)
         (tuple<duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>)
         local_18._M_head_impl;
    local_18._M_head_impl = (TableDeleteState *)0x0;
    ::std::__uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
    ::reset((__uniq_ptr_impl<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
             *)&this->delete_state,
            (pointer)__p._M_t.
                     super__Tuple_impl<0UL,_duckdb::TableDeleteState_*,_std::default_delete<duckdb::TableDeleteState>_>
                     .super__Head_base<0UL,_duckdb::TableDeleteState_*,_false>._M_head_impl);
    ::std::unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>::
    ~unique_ptr((unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>_>
                 *)&stack0xffffffffffffffe8);
  }
  pTVar1 = unique_ptr<duckdb::TableDeleteState,_std::default_delete<duckdb::TableDeleteState>,_true>
           ::operator*(&this->delete_state);
  return pTVar1;
}

Assistant:

TableDeleteState &InsertLocalState::GetDeleteState(DataTable &table, TableCatalogEntry &table_ref,
                                                   ClientContext &context) {
	if (!delete_state) {
		delete_state = table.InitializeDelete(table_ref, context, bound_constraints);
	}
	return *delete_state;
}